

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmWrap<cmGraphEdgeList>
                   (string *__return_storage_ptr__,string_view prefix,cmGraphEdgeList *rng,
                   string_view suffix,string_view sep)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  cmGraphEdgeList *rng_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  size_t local_f8;
  char *pcStack_f0;
  char *local_e8;
  char *pcStack_e0;
  iterator local_d8;
  undefined8 local_d0;
  string local_c8;
  string_view local_a8;
  string local_98;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined1 local_68 [16];
  cmGraphEdgeList *local_58;
  size_t sStack_50;
  iterator local_48;
  undefined8 local_40;
  cmGraphEdgeList *local_38;
  cmGraphEdgeList *rng_local;
  string_view suffix_local;
  string_view prefix_local;
  
  suffix_local._M_len = (size_t)suffix._M_str;
  rng_local = (cmGraphEdgeList *)suffix._M_len;
  suffix_local._M_str = (char *)prefix._M_len;
  local_38 = rng;
  bVar1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::empty
                    (&rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
  rng_00 = local_38;
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_78._M_len = (size_t)suffix_local._M_str;
    local_108._M_len = (size_t)rng_local;
    local_108._M_str = (char *)suffix_local._M_len;
    local_f8 = sep._M_len;
    pcStack_f0 = sep._M_str;
    local_e8 = suffix_local._M_str;
    local_d8 = &local_108;
    local_d0 = 3;
    views._M_len = 3;
    views._M_array = local_d8;
    pcStack_e0 = prefix._M_str;
    local_78._M_str = prefix._M_str;
    cmCatViews_abi_cxx11_(&local_c8,views);
    local_a8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
    cmJoin<cmGraphEdgeList>(&local_98,rng_00,local_a8);
    local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
    local_58 = rng_local;
    sStack_50 = suffix_local._M_len;
    local_48 = &local_78;
    local_40 = 3;
    views_00._M_len = 3;
    views_00._M_array = local_48;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views_00);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmWrap(cm::string_view prefix, Range const& rng,
                   cm::string_view suffix, cm::string_view sep)
{
  if (rng.empty()) {
    return std::string();
  }
  return cmCatViews(
    { prefix, cmJoin(rng, cmCatViews({ suffix, sep, prefix })), suffix });
}